

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  string *str;
  ostream *poVar1;
  TestProperty *pTVar2;
  int i;
  size_type *local_b8;
  string kProperty;
  undefined1 local_88 [16];
  size_type *local_78;
  string kProperties;
  long local_50;
  undefined1 local_48 [23];
  allocator local_31;
  
  local_78 = &kProperties._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"properties","");
  local_b8 = &kProperty._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"property","");
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"<",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(char *)local_78,(long)kProperties._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,">\n",2);
    if (0 < (int)((ulong)((long)(result->test_properties_).
                                super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(result->test_properties_).
                               super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
      i = 0;
      str = (string *)(kProperty.field_2._M_local_buf + 8);
      do {
        pTVar2 = TestResult::GetTestProperty(result,i);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"<",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (stream,(char *)local_b8,(long)kProperty._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(stream," name=\"",7);
        std::__cxx11::string::string((string *)str,(pTVar2->key_)._M_dataplus._M_p,&local_31);
        EscapeXml((string *)((long)&kProperties.field_2 + 8),str,true);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)kProperties.field_2._8_8_,local_50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
        if ((undefined1 *)kProperties.field_2._8_8_ != local_48) {
          operator_delete((void *)kProperties.field_2._8_8_);
        }
        if ((undefined1 *)kProperty.field_2._8_8_ != local_88) {
          operator_delete((void *)kProperty.field_2._8_8_);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream," value=\"",8);
        std::__cxx11::string::string((string *)str,(pTVar2->value_)._M_dataplus._M_p,&local_31);
        EscapeXml((string *)((long)&kProperties.field_2 + 8),str,true);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)kProperties.field_2._8_8_,local_50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
        if ((undefined1 *)kProperties.field_2._8_8_ != local_48) {
          operator_delete((void *)kProperties.field_2._8_8_);
        }
        if ((undefined1 *)kProperty.field_2._8_8_ != local_88) {
          operator_delete((void *)kProperty.field_2._8_8_);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"/>\n",3);
        i = i + 1;
      } while (i < (int)((ulong)((long)(result->test_properties_).
                                       super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(result->test_properties_).
                                      super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6));
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"</",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(char *)local_78,(long)kProperties._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,">\n",2);
  }
  if (local_b8 != &kProperty._M_string_length) {
    operator_delete(local_b8);
  }
  if (local_78 != &kProperties._M_string_length) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "<" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "<" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "</" << kProperties << ">\n";
}